

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O2

int run_ipc_send_recv_helper(uv_loop_t *loop,int inprocess)

{
  int iVar1;
  undefined8 uVar2;
  
  is_in_process = inprocess;
  memset(&ctx2,0,0x608);
  iVar1 = uv_pipe_init(loop,&ctx2,0);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_init(loop,0x2b3e30,1);
    if (iVar1 == 0) {
      if (inprocess == 0) {
        iVar1 = uv_pipe_open(0x2b3e30,0);
        if (iVar1 != 0) {
          uVar2 = 0x188;
          goto LAB_00138d6f;
        }
        send_recv_start();
      }
      else {
        iVar1 = uv_pipe_bind(&ctx2,"/tmp/uv-test-sock3");
        if (iVar1 != 0) {
          uVar2 = 0x182;
          goto LAB_00138d6f;
        }
        iVar1 = uv_listen(&ctx2,0x1000,listen_cb);
        if (iVar1 != 0) {
          uVar2 = 0x185;
          goto LAB_00138d6f;
        }
      }
      notify_parent_process();
      iVar1 = uv_run(loop,0);
      if (iVar1 == 0) {
        return 0;
      }
      uVar2 = 399;
    }
    else {
      uVar2 = 0x17e;
    }
  }
  else {
    uVar2 = 0x17b;
  }
LAB_00138d6f:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
          ,uVar2,"r == 0");
  abort();
}

Assistant:

int run_ipc_send_recv_helper(uv_loop_t* loop, int inprocess) {
  int r;

  is_in_process = inprocess;

  memset(&ctx2, 0, sizeof(ctx2));

  r = uv_pipe_init(loop, &ctx2.listen, 0);
  ASSERT(r == 0);

  r = uv_pipe_init(loop, &ctx2.channel, 1);
  ASSERT(r == 0);

  if (inprocess) {
    r = uv_pipe_bind(&ctx2.listen, TEST_PIPENAME_3);
    ASSERT(r == 0);

    r = uv_listen((uv_stream_t*)&ctx2.listen, SOMAXCONN, listen_cb);
    ASSERT(r == 0);
  } else {
    r = uv_pipe_open(&ctx2.channel, 0);
    ASSERT(r == 0);

    send_recv_start();
  }

  notify_parent_process();
  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  return 0;
}